

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void pnga_sprs_array_diag_left_multiply(Integer s_a,Integer g_d)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  Integer IVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  Integer g_a;
  void *__ptr;
  long in_RSI;
  long in_RDI;
  double ival_3;
  double rval_3;
  double ibuf_3;
  double rbuf_3;
  double *_ptr_13;
  double *_buf_13;
  float ival_2;
  float rval_2;
  float ibuf_2;
  float rbuf_2;
  float *_ptr_12;
  float *_buf_12;
  double *_ptr_11;
  double *_buf_11;
  float *_ptr_10;
  float *_buf_10;
  longlong *_ptr_9;
  longlong *_buf_9;
  long *_ptr_8;
  long *_buf_8;
  int *_ptr_7;
  int *_buf_7;
  double ival_1;
  double rval_1;
  double ibuf_1;
  double rbuf_1;
  double *_ptr_6;
  double *_buf_6;
  float ival;
  float rval;
  float ibuf;
  float rbuf;
  float *_ptr_5;
  float *_buf_5;
  double *_ptr_4;
  double *_buf_4;
  float *_ptr_3;
  float *_buf_3;
  longlong *_ptr_2;
  longlong *_buf_2;
  long *_ptr_1;
  long *_buf_1;
  int *_ptr;
  int *_buf;
  void *vptr;
  void *vbuf;
  Integer one;
  int64_t *jlptr;
  int64_t *ilptr;
  int *jptr;
  int *iptr;
  int idx_size;
  Integer type;
  Integer ncols;
  Integer iproc;
  Integer j;
  Integer i;
  Integer khi;
  Integer klo;
  Integer jhi;
  Integer jlo;
  Integer ihi;
  Integer ilo;
  Integer nproc;
  Integer me;
  Integer grp;
  int local_sync_end;
  int local_sync_begin;
  Integer d_hdl;
  Integer hdl;
  double in_stack_fffffffffffffdf0;
  Integer *in_stack_fffffffffffffe08;
  Integer *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  void *in_stack_fffffffffffffe60;
  void *in_stack_fffffffffffffe68;
  void *in_stack_fffffffffffffe70;
  void *in_stack_fffffffffffffe78;
  void *in_stack_fffffffffffffe80;
  void *local_d8;
  long local_88;
  long local_80;
  Integer in_stack_ffffffffffffff88;
  Integer *pIVar16;
  char *in_stack_ffffffffffffff90;
  Integer *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  Integer *in_stack_ffffffffffffffb0;
  Integer *in_stack_ffffffffffffffb8;
  
  lVar14 = in_RDI + 1000;
  lVar15 = in_RSI + 1000;
  IVar11 = SPA[lVar14].grp;
  pnga_pgroup_nodeid(IVar11);
  g_a = pnga_pgroup_nnodes(IVar11);
  iVar13 = _ga_sync_end;
  iVar9 = _ga_sync_begin;
  lVar12 = SPA[lVar14].type;
  IVar11 = SPA[lVar14].idx_size;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar9 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffdf0);
  }
  if (SPA[lVar14].idim != GA[lVar15].dims[0]) {
    pnga_error(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  if (lVar12 != GA[lVar15].type) {
    pnga_error(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  if (GA[lVar15].ndim != 1) {
    pnga_error(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  pnga_sprs_array_row_distribution
            (CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),in_stack_fffffffffffffe10
             ,in_stack_fffffffffffffe08);
  __ptr = malloc(((long)in_stack_ffffffffffffffb0 + (1 - (long)in_stack_ffffffffffffffb8)) *
                 SPA[lVar14].size);
  pnga_get(g_a,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
           in_stack_ffffffffffffffa0);
  for (local_88 = 0; local_88 < g_a; local_88 = local_88 + 1) {
    pnga_sprs_array_column_distribution
              (in_RDI,local_88,(Integer *)&stack0xffffffffffffffa8,
               (Integer *)&stack0xffffffffffffffa0);
    if ((int)IVar11 == 4) {
      pnga_sprs_array_access_col_block
                ((Integer)in_stack_fffffffffffffe80,(Integer)in_stack_fffffffffffffe78,
                 in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      if (local_d8 != (void *)0x0) {
        pIVar16 = in_stack_ffffffffffffffb8;
        if (lVar12 == 0x3e9) {
          for (; (long)pIVar16 <= (long)in_stack_ffffffffffffffb0;
              pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            iVar9 = *(int *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 4);
            iVar10 = *(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4);
            for (local_80 = 0; local_80 < iVar9 - iVar10; local_80 = local_80 + 1) {
              *(int *)((long)local_d8 +
                      (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) + local_80) *
                      4) = *(int *)((long)__ptr +
                                   ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) *
                           *(int *)((long)local_d8 +
                                   (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4)
                                   + local_80) * 4);
            }
          }
        }
        else if (lVar12 == 0x3ea) {
          for (; (long)pIVar16 <= (long)in_stack_ffffffffffffffb0;
              pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            iVar9 = *(int *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 4);
            iVar10 = *(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4);
            for (local_80 = 0; local_80 < iVar9 - iVar10; local_80 = local_80 + 1) {
              *(long *)((long)local_d8 +
                       (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) + local_80)
                       * 8) =
                   *(long *)((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) *
                   *(long *)((long)local_d8 +
                            (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) +
                            local_80) * 8);
            }
          }
        }
        else if (lVar12 == 0x3f8) {
          for (; (long)pIVar16 <= (long)in_stack_ffffffffffffffb0;
              pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            iVar9 = *(int *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 4);
            iVar10 = *(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4);
            for (local_80 = 0; local_80 < iVar9 - iVar10; local_80 = local_80 + 1) {
              *(long *)((long)local_d8 +
                       (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) + local_80)
                       * 8) =
                   *(long *)((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) *
                   *(long *)((long)local_d8 +
                            (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) +
                            local_80) * 8);
            }
          }
        }
        else if (lVar12 == 0x3eb) {
          for (; (long)pIVar16 <= (long)in_stack_ffffffffffffffb0;
              pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            iVar9 = *(int *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 4);
            iVar10 = *(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4);
            for (local_80 = 0; local_80 < iVar9 - iVar10; local_80 = local_80 + 1) {
              *(float *)((long)local_d8 +
                        (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) + local_80)
                        * 4) =
                   *(float *)((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) *
                   *(float *)((long)local_d8 +
                             (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) +
                             local_80) * 4);
            }
          }
        }
        else if (lVar12 == 0x3ec) {
          for (; (long)pIVar16 <= (long)in_stack_ffffffffffffffb0;
              pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            iVar9 = *(int *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 4);
            iVar10 = *(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4);
            for (local_80 = 0; local_80 < iVar9 - iVar10; local_80 = local_80 + 1) {
              *(double *)
               ((long)local_d8 +
               (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) + local_80) * 8) =
                   *(double *)((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8)
                   * *(double *)
                      ((long)local_d8 +
                      (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) + local_80) *
                      8);
            }
          }
        }
        else if (lVar12 == 0x3ee) {
          for (; (long)pIVar16 <= (long)in_stack_ffffffffffffffb0;
              pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            iVar9 = *(int *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 4);
            iVar10 = *(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4);
            for (local_80 = 0; local_80 < iVar9 - iVar10; local_80 = local_80 + 1) {
              fVar1 = *(float *)((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8
                                );
              fVar2 = *(float *)((long)__ptr +
                                ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8 + 4);
              fVar3 = *(float *)((long)local_d8 +
                                (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) +
                                local_80) * 8);
              fVar4 = *(float *)((long)local_d8 +
                                (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) +
                                local_80) * 8 + 4);
              *(float *)((long)local_d8 +
                        (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) + local_80)
                        * 8) = fVar1 * fVar3 + -(fVar2 * fVar4);
              *(float *)((long)local_d8 +
                        (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) + local_80)
                        * 8 + 4) = fVar1 * fVar4 + fVar2 * fVar3;
            }
          }
        }
        else if (lVar12 == 0x3ef) {
          for (; (long)pIVar16 <= (long)in_stack_ffffffffffffffb0;
              pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            iVar9 = *(int *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 4);
            iVar10 = *(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4);
            for (local_80 = 0; local_80 < iVar9 - iVar10; local_80 = local_80 + 1) {
              dVar5 = *(double *)
                       ((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 0x10);
              dVar6 = *(double *)
                       ((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 0x10 + 8);
              dVar7 = *(double *)
                       ((long)local_d8 +
                       (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) + local_80)
                       * 0x10);
              dVar8 = *(double *)
                       ((long)local_d8 +
                       (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) + local_80)
                       * 0x10 + 8);
              *(double *)
               ((long)local_d8 +
               (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) + local_80) * 0x10)
                   = dVar5 * dVar7 + -(dVar6 * dVar8);
              *(double *)
               ((long)local_d8 +
               (*(int *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) + local_80) * 0x10 +
               8) = dVar5 * dVar8 + dVar6 * dVar7;
            }
          }
        }
      }
    }
    else {
      pnga_sprs_array_access_col_block
                ((Integer)in_stack_fffffffffffffe80,(Integer)in_stack_fffffffffffffe78,
                 in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      if (local_d8 != (void *)0x0) {
        pIVar16 = in_stack_ffffffffffffffb8;
        if (lVar12 == 0x3e9) {
          for (; in_stack_fffffffffffffe78 = local_d8, in_stack_fffffffffffffe80 = __ptr,
              (long)pIVar16 <= (long)in_stack_ffffffffffffffb0;
              pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            lVar14 = *(long *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 8);
            lVar15 = *(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8);
            for (local_80 = 0; local_80 < lVar14 - lVar15; local_80 = local_80 + 1) {
              *(int *)((long)local_d8 +
                      (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) + local_80)
                      * 4) = *(int *)((long)__ptr +
                                     ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) *
                             *(int *)((long)local_d8 +
                                     (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) *
                                               8) + local_80) * 4);
            }
          }
        }
        else if (lVar12 == 0x3ea) {
          for (; in_stack_fffffffffffffe68 = local_d8, in_stack_fffffffffffffe70 = __ptr,
              (long)pIVar16 <= (long)in_stack_ffffffffffffffb0;
              pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            lVar14 = *(long *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 8);
            lVar15 = *(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8);
            for (local_80 = 0; local_80 < lVar14 - lVar15; local_80 = local_80 + 1) {
              *(long *)((long)local_d8 +
                       (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) + local_80)
                       * 8) =
                   *(long *)((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) *
                   *(long *)((long)local_d8 +
                            (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) +
                            local_80) * 8);
            }
          }
        }
        else if (lVar12 == 0x3f8) {
          for (; in_stack_fffffffffffffe60 = __ptr, (long)pIVar16 <= (long)in_stack_ffffffffffffffb0
              ; pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            lVar14 = *(long *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 8);
            lVar15 = *(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8);
            for (local_80 = 0; local_80 < lVar14 - lVar15; local_80 = local_80 + 1) {
              *(long *)((long)local_d8 +
                       (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) + local_80)
                       * 8) =
                   *(long *)((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) *
                   *(long *)((long)local_d8 +
                            (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) +
                            local_80) * 8);
            }
          }
        }
        else if (lVar12 == 0x3eb) {
          for (; (long)pIVar16 <= (long)in_stack_ffffffffffffffb0;
              pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            lVar14 = *(long *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 8);
            lVar15 = *(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8);
            for (local_80 = 0; local_80 < lVar14 - lVar15; local_80 = local_80 + 1) {
              *(float *)((long)local_d8 +
                        (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) + local_80
                        ) * 4) =
                   *(float *)((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 4) *
                   *(float *)((long)local_d8 +
                             (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) +
                             local_80) * 4);
            }
          }
        }
        else if (lVar12 == 0x3ec) {
          for (; (long)pIVar16 <= (long)in_stack_ffffffffffffffb0;
              pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            lVar14 = *(long *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 8);
            lVar15 = *(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8);
            for (local_80 = 0; local_80 < lVar14 - lVar15; local_80 = local_80 + 1) {
              *(double *)
               ((long)local_d8 +
               (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) + local_80) * 8) =
                   *(double *)((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8)
                   * *(double *)
                      ((long)local_d8 +
                      (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) + local_80)
                      * 8);
            }
          }
        }
        else if (lVar12 == 0x3ee) {
          for (; (long)pIVar16 <= (long)in_stack_ffffffffffffffb0;
              pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            lVar14 = *(long *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 8);
            lVar15 = *(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8);
            for (local_80 = 0; local_80 < lVar14 - lVar15; local_80 = local_80 + 1) {
              fVar1 = *(float *)((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8
                                );
              fVar2 = *(float *)((long)__ptr +
                                ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8 + 4);
              fVar3 = *(float *)((long)local_d8 +
                                (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) +
                                local_80) * 8);
              fVar4 = *(float *)((long)local_d8 +
                                (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) +
                                local_80) * 8 + 4);
              *(float *)((long)local_d8 +
                        (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) + local_80
                        ) * 8) = fVar1 * fVar3 + -(fVar2 * fVar4);
              *(float *)((long)local_d8 +
                        (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) + local_80
                        ) * 8 + 4) = fVar1 * fVar4 + fVar2 * fVar3;
            }
          }
        }
        else if (lVar12 == 0x3ef) {
          for (; (long)pIVar16 <= (long)in_stack_ffffffffffffffb0;
              pIVar16 = (Integer *)((long)pIVar16 + 1)) {
            lVar14 = *(long *)(((long)pIVar16 + (1 - (long)in_stack_ffffffffffffffb8)) * 8);
            lVar15 = *(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8);
            for (local_80 = 0; local_80 < lVar14 - lVar15; local_80 = local_80 + 1) {
              dVar5 = *(double *)
                       ((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 0x10);
              dVar6 = *(double *)
                       ((long)__ptr + ((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 0x10 + 8);
              in_stack_fffffffffffffdf0 =
                   *(double *)
                    ((long)local_d8 +
                    (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) + local_80) *
                    0x10);
              dVar7 = *(double *)
                       ((long)local_d8 +
                       (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) + local_80)
                       * 0x10 + 8);
              *(double *)
               ((long)local_d8 +
               (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) + local_80) * 0x10)
                   = dVar5 * in_stack_fffffffffffffdf0 + -(dVar6 * dVar7);
              *(double *)
               ((long)local_d8 +
               (*(long *)(((long)pIVar16 - (long)in_stack_ffffffffffffffb8) * 8) + local_80) * 0x10
               + 8) = dVar5 * dVar7 + dVar6 * in_stack_fffffffffffffdf0;
            }
          }
        }
      }
    }
  }
  free(__ptr);
  if (iVar13 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffdf0);
  }
  return;
}

Assistant:

void pnga_sprs_array_diag_left_multiply(Integer s_a, Integer g_d)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer d_hdl = GA_OFFSET + g_d;
  int local_sync_begin,local_sync_end;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer ilo, ihi, jlo, jhi, klo, khi;
  Integer i, j, iproc, ncols;
  Integer type = SPA[hdl].type;
  int idx_size = SPA[hdl].idx_size;
  int *iptr = NULL, *jptr = NULL;
  int64_t *ilptr = NULL, *jlptr = NULL;
  Integer one = 1;
  void *vbuf;
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* check for basic compatibility */
  if (SPA[hdl].idim != GA[d_hdl].dims[0]) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) dimensions don't match",0);
  }
  if (type != GA[d_hdl].type) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) data types don't match",0);
  }
  if (GA[d_hdl].ndim != 1) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) vector not of dimension 1",0);
  }

#define SPRS_REAL_LEFT_MULTIPLY_M(_type,_iptr)                        \
  {                                                                   \
    _type *_buf = (_type*)vbuf;                                       \
    _type *_ptr = (_type*)vptr;                                       \
    for (i=ilo; i<=ihi; i++) {                                        \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                            \
      for (j=0; j<ncols; j++) {                                       \
        _ptr[_iptr[i-ilo]+j] = _buf[i-ilo]*_ptr[_iptr[i-ilo]+j];      \
      }                                                               \
    }                                                                 \
  }

#define SPRS_COMPLEX_LEFT_MULTIPLY_M(_type,_iptr)                     \
  {                                                                   \
    _type *_buf = (_type*)vbuf;                                       \
    _type *_ptr = (_type*)vptr;                                       \
    _type rbuf, ibuf, rval, ival;                                     \
    for (i=ilo; i<=ihi; i++) {                                        \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                            \
      for (j=0; j<ncols; j++) {                                       \
        rbuf = _buf[2*(i-ilo)];                                       \
        ibuf = _buf[2*(i-ilo)+1];                                     \
        rval = _ptr[2*(_iptr[i-ilo]+j)];                              \
        ival = _ptr[2*(_iptr[i-ilo]+j)+1];                            \
        _ptr[2*(_iptr[i-ilo]+j)] = rbuf*rval-ibuf*ival;               \
        _ptr[2*(_iptr[i-ilo]+j)+1] = rbuf*ival+ibuf*rval;             \
      }                                                               \
    }                                                                 \
  }

  /* get block from diagonal array corresponding to this row block (there is
   * only one) */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  vbuf = malloc((ihi-ilo+1)*SPA[hdl].size);
  klo = ilo+1;
  khi = ihi+1;
  pnga_get(g_d,&klo,&khi,vbuf,&one);
  /* loop over blocks in sparse array */
  for (iproc=0; iproc<nproc; iproc++) {
    pnga_sprs_array_column_distribution(s_a,iproc,&jlo,&jhi);
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_LEFT_MULTIPLY_M(int,iptr);
        } else if (type == C_LONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long,iptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long long,iptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_LEFT_MULTIPLY_M(float,iptr);
        } else if (type == C_DBL) {
          SPRS_REAL_LEFT_MULTIPLY_M(double,iptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(float,iptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(double,iptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_LEFT_MULTIPLY_M(int,ilptr);
        } else if (type == C_LONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long,ilptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long long,ilptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_LEFT_MULTIPLY_M(float,ilptr);
        } else if (type == C_DBL) {
          SPRS_REAL_LEFT_MULTIPLY_M(double,ilptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(float,ilptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(double,ilptr);
        }
      }
    }
  }
  free(vbuf);

#undef SPRS_REAL_LEFT_MULTIPLY
#undef SPRS_COMPLEX_LEFT_MULTIPLY

  if (local_sync_end) pnga_pgroup_sync(grp);
}